

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O3

void __thiscall
ft::
RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
::treeTerminate(RBTree<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->NIL->value).first._M_dataplus._M_p;
  paVar2 = &(this->NIL->value).first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_first->value).first._M_dataplus._M_p;
  paVar2 = &(this->m_first->value).first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_last->value).first._M_dataplus._M_p;
  paVar2 = &(this->m_last->value).first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  operator_delete(this->NIL);
  operator_delete(this->m_first);
  operator_delete(this->m_last);
  return;
}

Assistant:

void treeTerminate() {
		this->m_alloc.destroy(this->NIL);
		this->m_alloc.destroy(this->m_first);
		this->m_alloc.destroy(this->m_last);
		this->m_alloc.deallocate(this->NIL, 1);
		this->m_alloc.deallocate(this->m_first, 1);
		this->m_alloc.deallocate(this->m_last, 1);
	}